

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

uint256 * anon_unknown.dwarf_1e9f79c::GetOutputsSHA256<CMutableTransaction>
                    (CMutableTransaction *txTo)

{
  bool bVar1;
  CTxOut *in_RDI;
  long in_FS_OFFSET;
  CTxOut *txout;
  vector<CTxOut,_std::allocator<CTxOut>_> *__range2;
  const_iterator __end0;
  const_iterator __begin0;
  HashWriter ss;
  CTxOut *obj;
  reference in_stack_ffffffffffffff68;
  undefined1 local_70 [104];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  obj = in_RDI;
  memset(local_70,0,0x68);
  HashWriter::HashWriter((HashWriter *)in_RDI);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::begin
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)obj);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::end((vector<CTxOut,_std::allocator<CTxOut>_> *)obj);
  while( true ) {
    bVar1 = __gnu_cxx::operator==<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                      ((__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                        *)in_stack_ffffffffffffff68,
                       (__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                        *)obj);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffff68 =
         __gnu_cxx::__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
         ::operator*((__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                      *)in_RDI);
    HashWriter::operator<<((HashWriter *)in_stack_ffffffffffffff68,obj);
    __gnu_cxx::__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>::
    operator++((__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_> *)
               in_RDI);
  }
  HashWriter::GetSHA256((HashWriter *)in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (uint256 *)obj;
  }
  __stack_chk_fail();
}

Assistant:

uint256 GetOutputsSHA256(const T& txTo)
{
    HashWriter ss{};
    for (const auto& txout : txTo.vout) {
        ss << txout;
    }
    return ss.GetSHA256();
}